

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_kotlin_kmp.cpp
# Opt level: O0

void __thiscall
flatbuffers::kotlin::KotlinKMPGenerator::GenerateCreateVectorField
          (KotlinKMPGenerator *this,FieldDef *field,CodeWriter *writer,IDLOptions *options)

{
  size_t sVar1;
  Type *type;
  anon_class_8_1_72ac95b1 local_228;
  function<void_()> local_220;
  string local_200;
  allocator<char> local_1d9;
  string local_1d8;
  string local_1b8;
  allocator<char> local_191;
  string local_190;
  string local_170;
  allocator<char> local_149;
  string local_148;
  undefined1 local_128 [8];
  string return_type;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> params;
  string array_param;
  string local_c0;
  allocator<char> local_89;
  string local_88;
  undefined1 local_68 [8];
  string method_name;
  Type vector_type;
  IDLOptions *options_local;
  CodeWriter *writer_local;
  FieldDef *field_local;
  KotlinKMPGenerator *this_local;
  
  Type::VectorType((Type *)((long)&method_name.field_2 + 8),&(field->value).type);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_88,"create",&local_89);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_c0,"vector",
             (allocator<char> *)(array_param.field_2._M_local_buf + 0xf));
  IdlNamer::Method((string *)local_68,&this->namer_,&local_88,field,&local_c0);
  std::__cxx11::string::~string((string *)&local_c0);
  std::allocator<char>::~allocator((allocator<char> *)(array_param.field_2._M_local_buf + 0xf));
  std::__cxx11::string::~string((string *)&local_88);
  std::allocator<char>::~allocator(&local_89);
  GenerateKotlinOffsetArray_abi_cxx11_
            ((string *)((long)&params.field_2 + 8),this,(Type *)((long)&method_name.field_2 + 8));
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&return_type.field_2 + 8),"builder: FlatBufferBuilder, vector:",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&params.field_2 + 8));
  GenType_abi_cxx11_((string *)local_128,this,&(field->value).type);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_148,"size",&local_149);
  sVar1 = InlineSize((Type *)((long)&method_name.field_2 + 8));
  NumToString<unsigned_long>(&local_170,sVar1);
  CodeWriter::SetValue(writer,&local_148,&local_170);
  std::__cxx11::string::~string((string *)&local_170);
  std::__cxx11::string::~string((string *)&local_148);
  std::allocator<char>::~allocator(&local_149);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_190,"align",&local_191);
  sVar1 = InlineAlignment((Type *)((long)&method_name.field_2 + 8));
  NumToString<unsigned_long>(&local_1b8,sVar1);
  CodeWriter::SetValue(writer,&local_190,&local_1b8);
  std::__cxx11::string::~string((string *)&local_1b8);
  std::__cxx11::string::~string((string *)&local_190);
  std::allocator<char>::~allocator(&local_191);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1d8,"root",&local_1d9);
  GenMethod_abi_cxx11_(&local_200,(KotlinKMPGenerator *)((long)&method_name.field_2 + 8),type);
  CodeWriter::SetValue(writer,&local_1d8,&local_200);
  std::__cxx11::string::~string((string *)&local_200);
  std::__cxx11::string::~string((string *)&local_1d8);
  std::allocator<char>::~allocator(&local_1d9);
  local_228.writer = writer;
  std::function<void()>::
  function<flatbuffers::kotlin::KotlinKMPGenerator::GenerateCreateVectorField(flatbuffers::FieldDef&,flatbuffers::CodeWriter&,flatbuffers::IDLOptions)const::_lambda()_1_,void>
            ((function<void()> *)&local_220,&local_228);
  GenerateFun(writer,(string *)local_68,(string *)((long)&return_type.field_2 + 8),
              (string *)local_128,&local_220,(bool)(options->gen_jvmstatic & 1));
  std::function<void_()>::~function(&local_220);
  std::__cxx11::string::~string((string *)local_128);
  std::__cxx11::string::~string((string *)(return_type.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)(params.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)local_68);
  return;
}

Assistant:

void GenerateCreateVectorField(FieldDef &field, CodeWriter &writer,
                                 const IDLOptions options) const {
    auto vector_type = field.value.type.VectorType();
    auto method_name = namer_.Method("create", field, "vector");
    auto array_param = GenerateKotlinOffsetArray(vector_type);
    auto params = "builder: FlatBufferBuilder, vector:" + array_param;
    auto return_type = GenType(field.value.type);
    writer.SetValue("size", NumToString(InlineSize(vector_type)));
    writer.SetValue("align", NumToString(InlineAlignment(vector_type)));
    writer.SetValue("root", GenMethod(vector_type));

    GenerateFun(
        writer, method_name, params, return_type,
        [&]() {
          writer += "builder.startVector({{size}}, vector.size, {{align}})";
          writer += "for (i in vector.size - 1 downTo 0) {";
          writer.IncrementIdentLevel();
          writer += "builder.add{{root}}(vector[i])";
          writer.DecrementIdentLevel();
          writer += "}";
          writer += "return builder.endVector()";
        },
        options.gen_jvmstatic);
  }